

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::tag<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  Name NVar1;
  bool bVar2;
  size_t sVar3;
  Name *pNVar4;
  Err *pEVar5;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar6;
  ImportNames *pIVar7;
  TypeUse *pTVar8;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_2a1;
  Err local_2a0;
  Err *local_280;
  Err *err_3;
  size_t local_258;
  char *pcStack_250;
  undefined1 local_248 [8];
  Result<wasm::Ok> _val_3;
  string local_218;
  Err local_1f8;
  Err local_1d8;
  Err *local_1b8;
  Err *err_2;
  Result<wasm::WATParser::TypeUse> _val_2;
  Result<wasm::WATParser::TypeUse> type;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseModuleTypesCtx *ctx_local;
  
  sVar3 = Lexer::getPos(&ctx->in);
  expected = sv("tag",3);
  bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar2) {
    wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._M_engaged);
    Lexer::takeID((optional<wasm::Name> *)
                  ((long)&exports.val.
                          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                          .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                  &ctx->in);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional *)
                       ((long)&exports.val.
                               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    if (bVar2) {
      pNVar4 = std::optional<wasm::Name>::operator*
                         ((optional<wasm::Name> *)
                          ((long)&exports.val.
                                  super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                  .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                  super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                  super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                  super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20)
                         );
      wasm::Name::operator=
                ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._M_engaged,pNVar4);
    }
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
    inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                  __return_storage_ptr___00,&ctx->in);
    Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
              ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
               (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
               __return_storage_ptr___00);
    local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                         ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8)
    ;
    bVar2 = local_c0 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_e0,local_c0);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
      wasm::Err::~Err(&local_e0);
    }
    Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
              ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
    if (bVar2) {
      inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20),&ctx->in);
      MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
                ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
                 (MaybeResult<wasm::WATParser::ImportNames> *)
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20));
      pEVar5 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                         ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
      if (pEVar5 != (Err *)0x0) {
        wasm::Err::Err((Err *)((long)&type.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20),pEVar5);
        MaybeResult<wasm::Ok>::MaybeResult
                  (__return_storage_ptr__,
                   (Err *)((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20
                          ));
        wasm::Err::~Err((Err *)((long)&type.val.
                                       super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                               0x20));
      }
      MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
                ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
      if (pEVar5 == (Err *)0x0) {
        typeuse<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::WATParser::TypeUse> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),ctx,
                   true);
        Result<wasm::WATParser::TypeUse>::Result
                  ((Result<wasm::WATParser::TypeUse> *)&err_2,
                   (Result<wasm::WATParser::TypeUse> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        local_1b8 = Result<wasm::WATParser::TypeUse>::getErr
                              ((Result<wasm::WATParser::TypeUse> *)&err_2);
        bVar2 = local_1b8 == (Err *)0x0;
        if (!bVar2) {
          wasm::Err::Err(&local_1d8,local_1b8);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1d8);
          wasm::Err::~Err(&local_1d8);
        }
        Result<wasm::WATParser::TypeUse>::~Result((Result<wasm::WATParser::TypeUse> *)&err_2);
        if (bVar2) {
          bVar2 = Lexer::takeRParen(&ctx->in);
          if (bVar2) {
            local_258 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._16_8_;
            pcStack_250 = (char *)name.super_IString.str._M_len;
            pvVar6 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                               ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                                ((long)&_val.val.
                                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                        .
                                        super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                        .super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> +
                                0x20));
            pIVar7 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                               ((MaybeResult<wasm::WATParser::ImportNames> *)
                                ((long)&_val_1.val.
                                        super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                + 0x20));
            pTVar8 = Result<wasm::WATParser::TypeUse>::operator*
                               ((Result<wasm::WATParser::TypeUse> *)
                                ((long)&_val_2.val.
                                        super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                + 0x20));
            TypeUse::TypeUse((TypeUse *)&err_3,pTVar8);
            local_20 = (Index)sVar3;
            NVar1.super_IString.str._M_str = pcStack_250;
            NVar1.super_IString.str._M_len = local_258;
            ParseModuleTypesCtx::addTag
                      ((Result<wasm::Ok> *)local_248,ctx,NVar1,pvVar6,pIVar7,(TypeUse *)&err_3,
                       local_20);
            TypeUse::~TypeUse((TypeUse *)&err_3);
            local_280 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_248);
            bVar2 = local_280 == (Err *)0x0;
            if (!bVar2) {
              wasm::Err::Err(&local_2a0,local_280);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2a0);
              wasm::Err::~Err(&local_2a0);
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_248);
            if (bVar2) {
              MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_2a1);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_218,"expected end of tag",
                       (allocator<char> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
            Lexer::err(&local_1f8,&ctx->in,&local_218);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1f8);
            wasm::Err::~Err(&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
          }
        }
        Result<wasm::WATParser::TypeUse>::~Result
                  ((Result<wasm::WATParser::TypeUse> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      }
      MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
                ((MaybeResult<wasm::WATParser::ImportNames> *)
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20));
    }
    Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
              ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
               ((long)&_val.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> tag(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("tag"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = typeuse(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of tag");
  }

  CHECK_ERR(ctx.addTag(name, *exports, import.getPtr(), *type, pos));
  return Ok{};
}